

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globalheap.h
# Opt level: O0

SuperblockType * __thiscall
Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::
get(GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType> *this
   ,size_t sz,void *dest)

{
  SuperblockType *pSVar1;
  SuperblockType *s;
  size_t in_stack_00000028;
  HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::EmptyHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>_>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>_>
  *in_stack_00000030;
  
  pSVar1 = HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::EmptyHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>_>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>_>
           ::get(in_stack_00000030,in_stack_00000028,
                 (ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>
                  *)this);
  return (SuperblockType *)pSVar1;
}

Assistant:

SuperblockType * get (size_t sz, void * dest) {
      auto * s = 
	reinterpret_cast<SuperblockType *>
	(_theHeap->get (sz, reinterpret_cast<SuperHeap *>(dest)));
      if (s) {
	assert (s->isValidSuperblock());
      }
      return s;
    }